

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O2

void sb_rsv_append_doc(fdb_kvs_handle *handle)

{
  undefined8 *puVar1;
  superblock *psVar2;
  sb_rsv_bmp *psVar3;
  uint uVar4;
  ulong uVar5;
  bid_t *pbVar6;
  docio_object *pdVar7;
  size_t sVar8;
  bid_t bVar9;
  long lVar10;
  ulong __nmemb;
  long lVar11;
  char doc_key [64];
  
  psVar2 = handle->file->sb;
  if (((psVar2 != (superblock *)0x0) && (psVar3 = psVar2->rsv_bmp, psVar3 != (sb_rsv_bmp *)0x0)) &&
     ((psVar3->status).super___atomic_base<unsigned_int>._M_i == 1)) {
    uVar5 = psVar3->bmp_size + 0x7fffff;
    __nmemb = uVar5 >> 0x17;
    psVar3->num_bmp_docs = __nmemb;
    if (0x7fffff < uVar5) {
      pbVar6 = (bid_t *)calloc(__nmemb,8);
      psVar3->bmp_doc_offset = pbVar6;
      pdVar7 = (docio_object *)calloc(__nmemb,0x38);
      psVar3->bmp_docs = pdVar7;
    }
    lVar10 = 0;
    uVar5 = 0;
    for (lVar11 = 0; __nmemb * 0x38 != lVar11; lVar11 = lVar11 + 0x38) {
      pdVar7 = psVar3->bmp_docs;
      puVar1 = (undefined8 *)((long)&pdVar7->field_3 + lVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pdVar7->timestamp + lVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&(pdVar7->length).keylen + lVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pdVar7->body + lVar11) = 0;
      sprintf(doc_key,"bitmap_%lu_%d",psVar3->bmp_revnum,uVar5 & 0xffffffff);
      pdVar7 = psVar3->bmp_docs;
      *(char **)((long)&pdVar7->key + lVar11) = doc_key;
      *(undefined8 *)((long)&pdVar7->meta + lVar11) = 0;
      *(uint8_t **)((long)&pdVar7->body + lVar11) = psVar3->bmp + lVar10;
      sVar8 = strlen(doc_key);
      *(short *)((long)&(pdVar7->length).keylen + lVar11) = (short)sVar8 + 1;
      *(undefined2 *)((long)&(pdVar7->length).metalen + lVar11) = 0;
      uVar4 = 0x100000;
      if (__nmemb * 0x38 + -0x38 == lVar11) {
        uVar4 = (uint)psVar3->bmp_size >> 3 & 0xfffff;
      }
      *(uint *)((long)&(pdVar7->length).bodylen + lVar11) = uVar4;
      *(undefined8 *)((long)&pdVar7->field_3 + lVar11) = 0;
      bVar9 = docio_append_doc_system
                        (handle->dhandle,
                         (docio_object *)((long)&(psVar3->bmp_docs->length).keylen + lVar11));
      psVar3->bmp_doc_offset[uVar5] = bVar9;
      uVar5 = uVar5 + 1;
      lVar10 = lVar10 + 0x100000;
    }
    LOCK();
    (psVar3->status).super___atomic_base<unsigned_int>._M_i = 0xffff;
    UNLOCK();
  }
  return;
}

Assistant:

void sb_rsv_append_doc(fdb_kvs_handle *handle)
{
    size_t i;
    uint64_t num_docs;
    char doc_key[64];
    struct superblock *sb = handle->file->sb;
    struct sb_rsv_bmp *rsv = NULL;

    if (!sb) {
        return;
    }

    rsv = sb->rsv_bmp;
    if (!rsv ||
        atomic_get_uint32_t(&rsv->status) != SB_RSV_INITIALIZING) {
        return;
    }

    rsv->num_bmp_docs = num_docs = _bmp_size_to_num_docs(rsv->bmp_size);
    if (num_docs) {
        rsv->bmp_doc_offset = (bid_t*)calloc(num_docs, sizeof(bid_t));
        rsv->bmp_docs = (struct docio_object*)
                        calloc(num_docs, sizeof(struct docio_object));
    }

    // bitmap doc offsets
    for (i=0; i<num_docs; ++i) {
        // append a system doc for bitmap chunk
        memset(&rsv->bmp_docs[i], 0x0, sizeof(struct docio_object));
        sprintf(doc_key, "bitmap_%" _F64 "_%d", rsv->bmp_revnum, (int)i);
        rsv->bmp_docs[i].key = (void*)doc_key;
        rsv->bmp_docs[i].meta = NULL;
        rsv->bmp_docs[i].body = rsv->bmp + (i * SB_MAX_BITMAP_DOC_SIZE);

        rsv->bmp_docs[i].length.keylen = strlen(doc_key)+1;
        rsv->bmp_docs[i].length.metalen = 0;
        if (i == num_docs - 1) {
            // the last doc
            rsv->bmp_docs[i].length.bodylen =
                (rsv->bmp_size / 8) % SB_MAX_BITMAP_DOC_SIZE;
        } else {
            // otherwise: 1MB
            rsv->bmp_docs[i].length.bodylen = SB_MAX_BITMAP_DOC_SIZE;
        }
        rsv->bmp_docs[i].seqnum = 0;
        rsv->bmp_doc_offset[i] =
            docio_append_doc_system(handle->dhandle, &rsv->bmp_docs[i]);
    }

    // now 'rsv_bmp' is available.
    atomic_store_uint32_t(&rsv->status, SB_RSV_READY);
}